

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O1

MyGame_Example_Any_union_ref_t
MyGame_Example_Any_clone(flatbuffers_builder_t *B,MyGame_Example_Any_union_t u)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  flatcc_builder_ref_t ref;
  flatcc_builder_ref_t ref_00;
  flatcc_refmap_ref_t ref_01;
  int iVar4;
  flatcc_builder_ref_t *pfVar5;
  void *pvVar6;
  MyGame_Example_Monster_table_t t;
  MyGame_Example_TestJSONPrefixParsing_table_t t_00;
  MyGame_Example_Monster_table_t pMVar7;
  MyGame_Example_TestJSONPrefixParsing_table_t s;
  uint uVar8;
  MyGame_Example_Any_union_ref_t MVar9;
  MyGame_Example_Monster_table_t src;
  
  t = (MyGame_Example_Monster_table_t)u.value;
  switch(u._0_4_ & 0xff) {
  case 1:
    uVar2 = MyGame_Example_Monster_clone(B,t);
    MVar9 = (MyGame_Example_Any_union_ref_t)(((ulong)uVar2 << 0x20) + 1);
    break;
  case 2:
    if (B->refmap == (flatcc_refmap_t *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = flatcc_refmap_find(B->refmap,t);
    }
    if (uVar2 == 0) {
      iVar3 = flatcc_builder_start_table(B,4);
      if (iVar3 == 0) {
        if (t == (MyGame_Example_Monster_table_t)0x0) {
          __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_reader.h"
                        ,0x3ae,
                        "const MyGame_Example_Color_enum_t *MyGame_Example_TestSimpleTableWithEnum_color_get_ptr(MyGame_Example_TestSimpleTableWithEnum_table_t)"
                       );
        }
        if (*(ushort *)(t + -(long)*(int *)t) < 6) {
          uVar1 = 0;
        }
        else {
          uVar1 = *(ushort *)(t + (4 - (long)*(int *)t));
        }
        if (uVar1 != 0) {
          uVar2 = 0;
          pvVar6 = flatcc_builder_table_add_copy(B,0,t + uVar1,1,1);
          if (pvVar6 == (void *)0x0) goto LAB_001119a0;
        }
        if (*(ushort *)(t + -(long)*(int *)t) < 8) {
          uVar1 = 0;
        }
        else {
          uVar1 = *(ushort *)(t + (6 - (long)*(int *)t));
        }
        if ((uVar1 == 0) ||
           (pvVar6 = flatcc_builder_table_add_copy(B,1,t + uVar1,1,1), pvVar6 != (void *)0x0)) {
          if (*(ushort *)(t + -(long)*(int *)t) < 10) {
            uVar1 = 0;
          }
          else {
            uVar1 = *(ushort *)(t + (8 - (long)*(int *)t));
          }
          if (((uVar1 == 0) ||
              (pvVar6 = flatcc_builder_table_add_copy(B,2,t + uVar1,1,1), pvVar6 != (void *)0x0)) &&
             (iVar3 = MyGame_Example_TestSimpleTableWithEnum_uc2_pick
                                (B,(MyGame_Example_TestSimpleTableWithEnum_table_t)t), iVar3 == 0))
          {
            uVar2 = MyGame_Example_TestSimpleTableWithEnum_end(B);
            if (B->refmap != (flatcc_refmap_t *)0x0) {
              uVar2 = flatcc_refmap_insert(B->refmap,t,uVar2);
            }
            goto LAB_001119a0;
          }
        }
      }
      uVar2 = 0;
    }
LAB_001119a0:
    MVar9 = (MyGame_Example_Any_union_ref_t)((ulong)uVar2 << 0x20 | 2);
    break;
  case 3:
    if (B->refmap == (flatcc_refmap_t *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = flatcc_refmap_find(B->refmap,t);
    }
    if (uVar2 == 0) {
      uVar2 = 0;
      iVar3 = flatcc_builder_start_table(B,0);
      if (iVar3 == 0) {
        iVar3 = flatcc_builder_check_required(B,__MyGame_Example2_Monster_required,0);
        if (iVar3 == 0) {
          __assert_fail("flatcc_builder_check_required(B, __MyGame_Example2_Monster_required, sizeof(__MyGame_Example2_Monster_required) / sizeof(__MyGame_Example2_Monster_required[0]) - 1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_builder.h"
                        ,0x108,
                        "MyGame_Example2_Monster_ref_t MyGame_Example2_Monster_end(flatbuffers_builder_t *)"
                       );
        }
        uVar2 = flatcc_builder_end_table(B);
        if (B->refmap != (flatcc_refmap_t *)0x0) {
          uVar2 = flatcc_refmap_insert(B->refmap,t,uVar2);
        }
      }
    }
    MVar9 = (MyGame_Example_Any_union_ref_t)((ulong)uVar2 << 0x20 | 3);
    break;
  case 4:
    if (B->refmap == (flatcc_refmap_t *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = flatcc_refmap_find(B->refmap,t);
    }
    if (uVar2 == 0) {
      iVar3 = flatcc_builder_start_table(B,9);
      if (iVar3 == 0) {
        if (t == (MyGame_Example_Monster_table_t)0x0) {
          __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_reader.h"
                        ,0x3d6,
                        "MyGame_Example_TestJSONPrefix_table_t MyGame_Example_Alt_prefix_get(MyGame_Example_Alt_table_t)"
                       );
        }
        if (*(ushort *)(t + -(long)*(int *)t) < 6) {
          uVar1 = 0;
        }
        else {
          uVar1 = *(ushort *)(t + (4 - (long)*(int *)t));
        }
        if (uVar1 == 0) {
          src = (MyGame_Example_Monster_table_t)0x0;
        }
        else {
          src = t + (ulong)*(uint *)(t + uVar1) + (ulong)uVar1;
        }
        if (src != (MyGame_Example_Monster_table_t)0x0) {
          if (B->refmap == (flatcc_refmap_t *)0x0) {
            ref = 0;
          }
          else {
            ref = flatcc_refmap_find(B->refmap,src);
          }
          if (ref == 0) {
            iVar3 = flatcc_builder_start_table(B,3);
            if (iVar3 == 0) {
              if (*(ushort *)(src + -(long)*(int *)src) < 6) {
                uVar1 = 0;
              }
              else {
                uVar1 = *(ushort *)(src + (4 - (long)*(int *)src));
              }
              if (uVar1 == 0) {
                t_00 = (MyGame_Example_TestJSONPrefixParsing_table_t)0x0;
              }
              else {
                t_00 = (MyGame_Example_TestJSONPrefixParsing_table_t)
                       (src + (ulong)*(uint *)(src + uVar1) + (ulong)uVar1);
              }
              if (t_00 != (MyGame_Example_TestJSONPrefixParsing_table_t)0x0) {
                if (B->refmap == (flatcc_refmap_t *)0x0) {
                  iVar3 = 0;
                }
                else {
                  iVar3 = flatcc_refmap_find(B->refmap,t_00);
                }
                if (iVar3 == 0) {
                  iVar3 = flatcc_builder_start_table(B,9);
                  if (iVar3 == 0) {
                    if (*(ushort *)(t_00 + -(long)*(int *)t_00) < 0xc) {
                      uVar1 = 0;
                    }
                    else {
                      uVar1 = *(ushort *)(t_00 + (10 - (long)*(int *)t_00));
                    }
                    if ((uVar1 == 0) ||
                       (pvVar6 = flatcc_builder_table_add_copy(B,3,t_00 + uVar1,8,8),
                       pvVar6 != (void *)0x0)) {
                      if (*(ushort *)(t_00 + -(long)*(int *)t_00) < 0x10) {
                        uVar1 = 0;
                      }
                      else {
                        uVar1 = *(ushort *)(t_00 + (0xe - (long)*(int *)t_00));
                      }
                      if ((uVar1 == 0) ||
                         (pvVar6 = flatcc_builder_table_add_copy(B,5,t_00 + uVar1,8,8),
                         pvVar6 != (void *)0x0)) {
                        if (*(ushort *)(t_00 + -(long)*(int *)t_00) < 0x14) {
                          uVar1 = 0;
                        }
                        else {
                          uVar1 = *(ushort *)(t_00 + (0x12 - (long)*(int *)t_00));
                        }
                        if ((uVar1 == 0) ||
                           (pvVar6 = flatcc_builder_table_add_copy(B,7,t_00 + uVar1,8,8),
                           pvVar6 != (void *)0x0)) {
                          if (*(ushort *)(t_00 + -(long)*(int *)t_00) < 6) {
                            uVar1 = 0;
                          }
                          else {
                            uVar1 = *(ushort *)(t_00 + (4 - (long)*(int *)t_00));
                          }
                          if (uVar1 == 0) {
                            s = (MyGame_Example_TestJSONPrefixParsing_table_t)0x0;
                          }
                          else {
                            s = t_00 + (ulong)*(uint *)(t_00 + uVar1) + (ulong)uVar1 + 4;
                          }
                          if (s != (MyGame_Example_TestJSONPrefixParsing_table_t)0x0) {
                            if (B->refmap == (flatcc_refmap_t *)0x0) {
                              iVar4 = 0;
                            }
                            else {
                              iVar4 = flatcc_refmap_find(B->refmap,s);
                            }
                            if (iVar4 == 0) {
                              iVar4 = flatcc_builder_create_string
                                                (B,(char *)s,(ulong)*(uint *)(s + -4));
                              if (B->refmap != (flatcc_refmap_t *)0x0) {
                                iVar4 = flatcc_refmap_insert(B->refmap,s,iVar4);
                              }
                            }
                            if (iVar4 == 0) goto LAB_00111ca2;
                            pfVar5 = flatcc_builder_table_add_offset(B,0);
                            iVar3 = 0;
                            if (pfVar5 == (flatcc_builder_ref_t *)0x0) goto LAB_00111ca4;
                            *pfVar5 = iVar4;
                          }
                          if (*(ushort *)(t_00 + -(long)*(int *)t_00) < 8) {
                            uVar1 = 0;
                          }
                          else {
                            uVar1 = *(ushort *)(t_00 + (6 - (long)*(int *)t_00));
                          }
                          if ((uVar1 == 0) ||
                             (pvVar6 = flatcc_builder_table_add_copy(B,1,t_00 + uVar1,4,4),
                             pvVar6 != (void *)0x0)) {
                            iVar4 = MyGame_Example_TestJSONPrefixParsing_bbbb_pick(B,t_00);
                            iVar3 = 0;
                            if ((iVar4 == 0) &&
                               (((iVar4 = MyGame_Example_TestJSONPrefixParsing_cccc_pick(B,t_00),
                                 iVar4 == 0 &&
                                 (iVar4 = MyGame_Example_TestJSONPrefixParsing_cccc12345_pick
                                                    (B,t_00), iVar3 = 0, iVar4 == 0)) &&
                                (iVar4 = MyGame_Example_TestJSONPrefixParsing_dddd12345_pick(B,t_00)
                                , iVar4 == 0)))) {
                              iVar3 = MyGame_Example_TestJSONPrefixParsing_end(B);
                              if (B->refmap != (flatcc_refmap_t *)0x0) {
                                iVar3 = flatcc_refmap_insert(B->refmap,t_00,iVar3);
                              }
                            }
                            goto LAB_00111ca4;
                          }
                        }
                      }
                    }
                  }
LAB_00111ca2:
                  iVar3 = 0;
                }
LAB_00111ca4:
                if (iVar3 == 0) goto LAB_00111b5b;
                ref = 0;
                pfVar5 = flatcc_builder_table_add_offset(B,0);
                if (pfVar5 == (flatcc_builder_ref_t *)0x0) goto LAB_00111b5e;
                *pfVar5 = iVar3;
              }
              if (*(ushort *)(src + -(long)*(int *)src) < 8) {
                uVar1 = 0;
              }
              else {
                uVar1 = *(ushort *)(src + (6 - (long)*(int *)src));
              }
              if (uVar1 == 0) {
                pMVar7 = (MyGame_Example_Monster_table_t)0x0;
              }
              else {
                pMVar7 = src + (ulong)*(uint *)(src + uVar1) + (ulong)uVar1;
              }
              if (pMVar7 != (MyGame_Example_Monster_table_t)0x0) {
                if (B->refmap == (flatcc_refmap_t *)0x0) {
                  ref_00 = 0;
                }
                else {
                  ref_00 = flatcc_refmap_find(B->refmap,pMVar7);
                }
                if (ref_00 == 0) {
                  iVar3 = flatcc_builder_start_table(B,2);
                  if (iVar3 == 0) {
                    if (*(ushort *)(pMVar7 + -(long)*(int *)pMVar7) < 6) {
                      uVar1 = 0;
                    }
                    else {
                      uVar1 = *(ushort *)(pMVar7 + (4 - (long)*(int *)pMVar7));
                    }
                    if (uVar1 != 0) {
                      ref_00 = 0;
                      pvVar6 = flatcc_builder_table_add_copy(B,0,pMVar7 + uVar1,8,8);
                      if (pvVar6 == (void *)0x0) goto LAB_00111d32;
                    }
                    if (*(ushort *)(pMVar7 + -(long)*(int *)pMVar7) < 8) {
                      uVar1 = 0;
                    }
                    else {
                      uVar1 = *(ushort *)(pMVar7 + (6 - (long)*(int *)pMVar7));
                    }
                    if ((uVar1 == 0) ||
                       (pvVar6 = flatcc_builder_table_add_copy(B,1,pMVar7 + uVar1,4,4),
                       pvVar6 != (void *)0x0)) {
                      iVar3 = flatcc_builder_check_required
                                        (B,__MyGame_Example_TestJSONPrefixParsing2_required,0);
                      if (iVar3 == 0) {
                        __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestJSONPrefixParsing2_required, sizeof(__MyGame_Example_TestJSONPrefixParsing2_required) / sizeof(__MyGame_Example_TestJSONPrefixParsing2_required[0]) - 1)"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_builder.h"
                                      ,0x135,
                                      "MyGame_Example_TestJSONPrefixParsing2_ref_t MyGame_Example_TestJSONPrefixParsing2_end(flatbuffers_builder_t *)"
                                     );
                      }
                      ref_00 = flatcc_builder_end_table(B);
                      if (B->refmap != (flatcc_refmap_t *)0x0) {
                        ref_00 = flatcc_refmap_insert(B->refmap,pMVar7,ref_00);
                      }
                      goto LAB_00111d32;
                    }
                  }
                  ref_00 = 0;
                }
LAB_00111d32:
                ref = 0;
                if ((ref_00 == 0) ||
                   (pfVar5 = flatcc_builder_table_add_offset(B,1),
                   pfVar5 == (flatcc_builder_ref_t *)0x0)) goto LAB_00111b5e;
                *pfVar5 = ref_00;
              }
              if (*(ushort *)(src + -(long)*(int *)src) < 10) {
                uVar1 = 0;
              }
              else {
                uVar1 = *(ushort *)(src + (8 - (long)*(int *)src));
              }
              if (uVar1 == 0) {
                pMVar7 = (MyGame_Example_Monster_table_t)0x0;
              }
              else {
                pMVar7 = src + (ulong)*(uint *)(src + uVar1) + (ulong)uVar1;
              }
              if (pMVar7 != (MyGame_Example_Monster_table_t)0x0) {
                if (B->refmap == (flatcc_refmap_t *)0x0) {
                  ref_01 = 0;
                }
                else {
                  ref_01 = flatcc_refmap_find(B->refmap,pMVar7);
                }
                if (ref_01 == 0) {
                  iVar3 = flatcc_builder_start_table(B,2);
                  if (iVar3 == 0) {
                    if (*(ushort *)(pMVar7 + -(long)*(int *)pMVar7) < 6) {
                      uVar1 = 0;
                    }
                    else {
                      uVar1 = *(ushort *)(pMVar7 + (4 - (long)*(int *)pMVar7));
                    }
                    if (uVar1 != 0) {
                      ref_01 = 0;
                      pvVar6 = flatcc_builder_table_add_copy(B,0,pMVar7 + uVar1,8,8);
                      if (pvVar6 == (void *)0x0) goto LAB_00111dc3;
                    }
                    if (*(ushort *)(pMVar7 + -(long)*(int *)pMVar7) < 8) {
                      uVar1 = 0;
                    }
                    else {
                      uVar1 = *(ushort *)(pMVar7 + (6 - (long)*(int *)pMVar7));
                    }
                    if ((uVar1 == 0) ||
                       (pvVar6 = flatcc_builder_table_add_copy(B,1,pMVar7 + uVar1,4,4),
                       pvVar6 != (void *)0x0)) {
                      iVar3 = flatcc_builder_check_required
                                        (B,__MyGame_Example_TestJSONPrefixParsing3_required,0);
                      if (iVar3 == 0) {
                        __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestJSONPrefixParsing3_required, sizeof(__MyGame_Example_TestJSONPrefixParsing3_required) / sizeof(__MyGame_Example_TestJSONPrefixParsing3_required[0]) - 1)"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_builder.h"
                                      ,0x13a,
                                      "MyGame_Example_TestJSONPrefixParsing3_ref_t MyGame_Example_TestJSONPrefixParsing3_end(flatbuffers_builder_t *)"
                                     );
                      }
                      ref_01 = flatcc_builder_end_table(B);
                      if (B->refmap != (flatcc_refmap_t *)0x0) {
                        ref_01 = flatcc_refmap_insert(B->refmap,pMVar7,ref_01);
                      }
                      goto LAB_00111dc3;
                    }
                  }
                  ref_01 = 0;
                }
LAB_00111dc3:
                ref = 0;
                if ((ref_01 == 0) ||
                   (pfVar5 = flatcc_builder_table_add_offset(B,2),
                   pfVar5 == (flatcc_builder_ref_t *)0x0)) goto LAB_00111b5e;
                *pfVar5 = ref_01;
              }
              iVar3 = flatcc_builder_check_required(B,__MyGame_Example_TestJSONPrefix_required,0);
              if (iVar3 == 0) {
                __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestJSONPrefix_required, sizeof(__MyGame_Example_TestJSONPrefix_required) / sizeof(__MyGame_Example_TestJSONPrefix_required[0]) - 1)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_builder.h"
                              ,299,
                              "MyGame_Example_TestJSONPrefix_ref_t MyGame_Example_TestJSONPrefix_end(flatbuffers_builder_t *)"
                             );
              }
              ref = flatcc_builder_end_table(B);
              if (B->refmap != (flatcc_refmap_t *)0x0) {
                ref = flatcc_refmap_insert(B->refmap,src,ref);
              }
            }
            else {
LAB_00111b5b:
              ref = 0;
            }
          }
LAB_00111b5e:
          if (ref == 0) goto LAB_00111977;
          pfVar5 = flatcc_builder_table_add_offset(B,0);
          uVar2 = 0;
          if (pfVar5 == (flatcc_builder_ref_t *)0x0) goto LAB_0011197a;
          *pfVar5 = ref;
        }
        iVar3 = MyGame_Example_Alt_movie_pick(B,(MyGame_Example_Alt_table_t)t);
        uVar8 = 0;
        uVar2 = 0;
        if ((((iVar3 == 0) &&
             (iVar3 = MyGame_Example_Alt_manyany_pick(B,(MyGame_Example_Alt_table_t)t), iVar3 == 0))
            && (iVar3 = MyGame_Example_Alt_multik_pick(B,(MyGame_Example_Alt_table_t)t),
               uVar2 = uVar8, iVar3 == 0)) &&
           (((iVar3 = MyGame_Example_Alt_rapunzels_pick(B,(MyGame_Example_Alt_table_t)t), iVar3 == 0
             && (iVar3 = MyGame_Example_Alt_names_pick(B,(MyGame_Example_Alt_table_t)t), iVar3 == 0)
             ) && ((iVar3 = MyGame_Example_Alt_samples_pick(B,(MyGame_Example_Alt_table_t)t),
                   iVar3 == 0 &&
                   (iVar3 = MyGame_Example_Alt_fixed_array_pick(B,(MyGame_Example_Alt_table_t)t),
                   iVar3 == 0)))))) {
          uVar2 = MyGame_Example_Alt_end(B);
          if (B->refmap != (flatcc_refmap_t *)0x0) {
            uVar2 = flatcc_refmap_insert(B->refmap,t,uVar2);
          }
        }
      }
      else {
LAB_00111977:
        uVar2 = 0;
      }
    }
LAB_0011197a:
    MVar9 = (MyGame_Example_Any_union_ref_t)((ulong)uVar2 << 0x20 | 4);
    break;
  default:
    MVar9.type = '\0';
    MVar9._1_3_ = 0;
    MVar9.value = 0;
  }
  return MVar9;
}

Assistant:

static MyGame_Example_Any_union_ref_t MyGame_Example_Any_clone(flatbuffers_builder_t *B, MyGame_Example_Any_union_t u)
{
    switch (u.type) {
    case 1: return MyGame_Example_Any_as_Monster(MyGame_Example_Monster_clone(B, (MyGame_Example_Monster_table_t)u.value));
    case 2: return MyGame_Example_Any_as_TestSimpleTableWithEnum(MyGame_Example_TestSimpleTableWithEnum_clone(B, (MyGame_Example_TestSimpleTableWithEnum_table_t)u.value));
    case 3: return MyGame_Example_Any_as_Monster2(MyGame_Example2_Monster_clone(B, (MyGame_Example2_Monster_table_t)u.value));
    case 4: return MyGame_Example_Any_as_Alt(MyGame_Example_Alt_clone(B, (MyGame_Example_Alt_table_t)u.value));
    default: return MyGame_Example_Any_as_NONE();
    }
}